

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableBase.cpp
# Opt level: O1

MemorySpace __thiscall adios2::core::VariableBase::GetMemorySpace(VariableBase *this,void *ptr)

{
  if (this->m_MemSpace == Detect) {
    this->m_MemSpace = Host;
  }
  return this->m_MemSpace;
}

Assistant:

MemorySpace VariableBase::GetMemorySpace(const void *ptr)
{
#if defined(ADIOS2_HAVE_KOKKOS) || defined(ADIOS2_HAVE_GPU_SUPPORT)
    ArrayOrdering layout = m_BaseLayout;
#endif
    // first time the memory space is set
    if (m_MemSpace == MemorySpace::Detect)
    {
#ifdef ADIOS2_HAVE_GPU_SUPPORT
        if (helper::IsGPUbuffer(ptr))
        {
            m_MemSpace = MemorySpace::GPU;
            layout = ArrayOrdering::ColumnMajor;
        }
        else
#endif
            m_MemSpace = MemorySpace::Host;
    }
#if defined(ADIOS2_HAVE_KOKKOS) || defined(ADIOS2_HAVE_GPU_SUPPORT)
    // set the layout based on the buffer memory space
    // skipping throwing an exception for a mismatch
    if (m_ArrayLayout == ArrayOrdering::Auto)
        SetArrayLayout(layout);
#endif
    return m_MemSpace;
}